

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumDescriptor *enum_descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  if (*(cpp **)(this + 0x18) == (cpp *)0x0) {
    ResolveKeyword(__return_storage_ptr__,*(string **)(this + 8));
  }
  else {
    ClassName_abi_cxx11_(&local_38,*(cpp **)(this + 0x18),(Descriptor *)enum_descriptor);
    std::operator+(&bStack_58,&local_38,"_");
    std::operator+(__return_storage_ptr__,&bStack_58,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8)
                  );
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassName(const EnumDescriptor* enum_descriptor) {
  if (enum_descriptor->containing_type() == nullptr) {
    return ResolveKeyword(enum_descriptor->name());
  } else {
    return ClassName(enum_descriptor->containing_type()) + "_" +
           enum_descriptor->name();
  }
}